

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O3

void __thiscall FIX::InvalidMessage::InvalidMessage(InvalidMessage *this,InvalidMessage *param_1)

{
  pointer pcVar1;
  
  std::logic_error::logic_error((logic_error *)this,(logic_error *)param_1);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f5720;
  (this->super_Exception).type._M_dataplus._M_p = (pointer)&(this->super_Exception).type.field_2;
  pcVar1 = (param_1->super_Exception).type._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Exception).type,pcVar1,
             pcVar1 + (param_1->super_Exception).type._M_string_length);
  (this->super_Exception).detail._M_dataplus._M_p = (pointer)&(this->super_Exception).detail.field_2
  ;
  pcVar1 = (param_1->super_Exception).detail._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Exception).detail,pcVar1,
             pcVar1 + (param_1->super_Exception).detail._M_string_length);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f6250;
  return;
}

Assistant:

InvalidMessage(const std::string &what = "")
      : Exception("Invalid message", what) {}